

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

SizedPtr google::protobuf::internal::anon_unknown_12::AllocateBlock
                   (AllocationPolicy *policy_ptr,size_t last_size,size_t min_bytes)

{
  ulong uVar1;
  ulong uVar2;
  AllocationPolicy *policy;
  SizedPtr SVar3;
  
  if (policy_ptr == (AllocationPolicy *)0x0) {
    uVar1 = 0x8000;
    uVar2 = 0x100;
    policy = (AllocationPolicy *)0x0;
  }
  else {
    uVar2 = policy_ptr->start_block_size;
    uVar1 = policy_ptr->max_block_size;
    policy = (AllocationPolicy *)policy_ptr->block_alloc;
  }
  if (min_bytes < 0xfffffffffffffff0) {
    if (last_size * 2 < uVar1) {
      uVar1 = last_size * 2;
    }
    if (last_size == 0) {
      uVar1 = uVar2;
    }
    uVar2 = min_bytes + 0x10;
    if (min_bytes + 0x10 < uVar1) {
      uVar2 = uVar1;
    }
    SVar3 = AllocateMemory(policy,uVar2);
    return SVar3;
  }
  _GLOBAL__N_1::AllocateBlock();
}

Assistant:

SizedPtr AllocateBlock(const AllocationPolicy* policy_ptr, size_t last_size,
                       size_t min_bytes) {
  AllocationPolicy policy;  // default policy
  if (policy_ptr) policy = *policy_ptr;
  size_t size =
      AllocationSize(last_size, policy.start_block_size, policy.max_block_size);
  // Verify that min_bytes + kBlockHeaderSize won't overflow.
  ABSL_CHECK_LE(min_bytes, std::numeric_limits<size_t>::max() -
                               SerialArena::kBlockHeaderSize);
  size = std::max(size, SerialArena::kBlockHeaderSize + min_bytes);

  return AllocateMemory(policy, size);
}